

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::addNode(Graph *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Node *node;
  
  node = (Node *)operator_new(0x48);
  iVar2 = this->inserted_nodes;
  (node->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (node->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(node->edges)._M_t._M_impl.super__Rb_tree_header;
  (node->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (node->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  node->error = 0.0;
  (node->edges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (node->coords).x = 0;
  (node->coords).y = 0;
  node->index = iVar2;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->adj_list,&node);
  this->inserted_nodes = this->inserted_nodes + 1;
  return;
}

Assistant:

void Graph::addNode() {
    // TODO: Modify function (Can fall on duplicate indexes)
    // Possible solution: add a variable that stores the number of total insertions
    Node* node = new Node(inserted_nodes);
    adj_list.push_back(node);
    inserted_nodes++;
}